

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumTextureHandle __thiscall
pbrt::SpectrumScaledTexture::Create
          (SpectrumScaledTexture *this,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  int iVar3;
  uintptr_t iptr;
  undefined4 extraout_var;
  ulong *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  Float cs;
  string ret;
  SpectrumTextureHandle tex;
  FloatTextureHandle scale;
  float local_6c;
  string local_68;
  TextureParameterDictionary local_48;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0x3f800000;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"tex","");
  local_48.spectrumTextures =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
        *)(CONCAT44(extraout_var,iVar3) | 0x1000000000000);
  TextureParameterDictionary::GetSpectrumTexture
            (&local_48,(string *)parameters,(SpectrumHandle *)&local_68,(int)&local_48 + 0x10,
             (Allocator)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"scale","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&local_48.floatTextures,(string *)parameters,1.0,
             (memory_resource *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((float *)((ulong)local_48.floatTextures & 0xffffffffffff) != (float *)0x0 &&
      (short)((ulong)local_48.floatTextures >> 0x30) == 5) {
    local_6c = *(float *)((ulong)local_48.floatTextures & 0xffffffffffff);
    if ((local_6c == 1.0) && (!NAN(local_6c))) {
      if (LOGGING_LogLevel < 1) {
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
            ,0x329,"Dropping useless scale by 1");
      }
      (this->tex).
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = 0;
      (this->tex).
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)local_48.dict;
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )this;
    }
    puVar6 = (undefined8 *)((ulong)local_48.dict & 0xffffffffffff);
    if (puVar6 != (undefined8 *)0x0 &&
        ((ulong)local_48.dict & 0xffff000000000000) == 0x3000000000000) {
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
      puVar5 = (undefined8 *)CONCAT44(extraout_var_01,iVar3);
      *puVar5 = 0;
      *puVar5 = *puVar6;
      uVar2 = puVar6[2];
      puVar5[1] = puVar6[1];
      puVar5[2] = uVar2;
      if (LOGGING_LogLevel < 1) {
        local_68._M_string_length = 0;
        local_68.field_2._M_local_buf[0] = '\0';
        local_68._M_dataplus._M_p = (pointer)paVar1;
        detail::stringPrintfRecursive<float&>
                  (&local_68,"Flattened scale %f * image texture",&local_6c);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
            ,0x32f,local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      *(float *)(puVar5 + 1) = local_6c * *(float *)(puVar5 + 1);
      (this->tex).
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (ulong)puVar5 | 0x3000000000000;
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )this;
    }
  }
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,8);
  puVar4 = (ulong *)CONCAT44(extraout_var_00,iVar3);
  *puVar4 = (ulong)local_48.dict;
  puVar4[1] = (ulong)local_48.floatTextures;
  (this->tex).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (ulong)puVar4 | 0x6000000000000;
  return (SpectrumTextureHandle)
         (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          )this;
}

Assistant:

SpectrumTextureHandle SpectrumScaledTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumTextureHandle tex =
        parameters.GetSpectrumTexture("tex", one, SpectrumType::Reflectance, alloc);
    FloatTextureHandle scale = parameters.GetFloatTexture("scale", 1.f, alloc);

    if (FloatConstantTexture *cscale = scale.CastOrNullptr<FloatConstantTexture>()) {
        Float cs = cscale->Evaluate({});
        if (cs == 1) {
            LOG_VERBOSE("Dropping useless scale by 1");
            return tex;
        } else if (SpectrumImageTexture *image =
                       tex.CastOrNullptr<SpectrumImageTexture>()) {
            SpectrumImageTexture *imageCopy =
                alloc.new_object<SpectrumImageTexture>(*image);
            LOG_VERBOSE("Flattened scale %f * image texture", cs);
            imageCopy->scale *= cs;
            return imageCopy;
        }
#if defined(PBRT_BUILD_GPU_RENDERER)
        else if (GPUSpectrumImageTexture *gimage =
                     tex.CastOrNullptr<GPUSpectrumImageTexture>()) {
            GPUSpectrumImageTexture *gimageCopy =
                alloc.new_object<GPUSpectrumImageTexture>(*gimage);
            LOG_VERBOSE("Flattened scale %f * gpu image texture", cs);
            gimageCopy->scale *= cs;
            return gimageCopy;
        }
#endif
    }

    return alloc.new_object<SpectrumScaledTexture>(tex, scale);
}